

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::moveAppend
          (QGenericArrayOps<QFileDialogPrivate::HistoryItem> *this,HistoryItem *b,HistoryItem *e)

{
  HistoryItem *pHVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  QPersistentModelIndex *pQVar6;
  qsizetype qVar7;
  
  if ((b != e) && (b < e)) {
    pHVar1 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr;
    qVar7 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size;
    do {
      pDVar2 = (b->path).d.d;
      (b->path).d.d = (Data *)0x0;
      pHVar1[qVar7].path.d.d = pDVar2;
      pcVar3 = (b->path).d.ptr;
      (b->path).d.ptr = (char16_t *)0x0;
      pHVar1[qVar7].path.d.ptr = pcVar3;
      qVar4 = (b->path).d.size;
      (b->path).d.size = 0;
      pHVar1[qVar7].path.d.size = qVar4;
      pDVar5 = (b->selection).d.d;
      (b->selection).d.d = (Data *)0x0;
      pHVar1[qVar7].selection.d.d = pDVar5;
      pQVar6 = (b->selection).d.ptr;
      (b->selection).d.ptr = (QPersistentModelIndex *)0x0;
      pHVar1[qVar7].selection.d.ptr = pQVar6;
      qVar4 = (b->selection).d.size;
      (b->selection).d.size = 0;
      pHVar1[qVar7].selection.d.size = qVar4;
      b = b + 1;
      qVar7 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size + 1;
      (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size = qVar7;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }